

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdAddMultisigSignDataToDer
              (void *handle,void *multisign_handle,char *signature,int sighash_type,
              bool sighash_anyone_can_pay,char *related_pubkey)

{
  undefined1 uVar1;
  undefined8 uVar2;
  uint8_t in_CL;
  char *in_RDX;
  byte in_R8B;
  char *in_stack_00000010;
  char *in_stack_00000018;
  void *in_stack_00000020;
  void *in_stack_00000028;
  CfdException *except;
  exception *std_except;
  ByteData signature_der;
  SignParameter param;
  ByteData signature_bytes;
  SigHashType sighashtype;
  SignParameter *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffe40;
  SigHashType *sighash_type_00;
  undefined8 in_stack_fffffffffffffe50;
  undefined1 der_encode;
  ByteData *in_stack_fffffffffffffe58;
  allocator *paVar3;
  undefined7 in_stack_fffffffffffffe60;
  string local_188;
  ByteData local_168;
  SigHashType local_14c [3];
  SignParameter *in_stack_fffffffffffffed8;
  undefined1 local_c1 [33];
  ByteData local_a0;
  SigHashType local_88;
  undefined1 local_7a;
  allocator local_79;
  string local_78 [32];
  CfdSourceLocation local_58 [2];
  byte local_25;
  uint8_t local_24;
  char *local_20;
  int local_4;
  
  der_encode = (undefined1)((ulong)in_stack_fffffffffffffe50 >> 0x38);
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  local_25 = in_R8B & 1;
  local_20 = in_RDX;
  local_24 = in_CL;
  cfd::Initialize();
  uVar1 = cfd::capi::IsEmptyString(local_20);
  if (!(bool)uVar1) {
    cfd::core::SigHashType::Create(&local_88,local_24,(bool)(local_25 & 1),false);
    sighash_type_00 = (SigHashType *)local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_c1 + 1),local_20,(allocator *)sighash_type_00);
    cfd::core::ByteData::ByteData(&local_a0,(string *)(local_c1 + 1));
    std::__cxx11::string::~string((string *)(local_c1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_c1);
    cfd::core::SigHashType::SigHashType(local_14c,&local_88);
    cfd::SignParameter::SignParameter
              ((SignParameter *)CONCAT17(uVar1,in_stack_fffffffffffffe60),in_stack_fffffffffffffe58,
               (bool)der_encode,sighash_type_00);
    cfd::SignParameter::ConvertToSignature(in_stack_fffffffffffffed8);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_188,&local_168);
    std::__cxx11::string::c_str();
    local_4 = CfdAddMultisigSignData
                        (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
    std::__cxx11::string::~string((string *)&local_188);
    cfd::core::ByteData::~ByteData((ByteData *)0x619f60);
    cfd::SignParameter::~SignParameter(in_stack_fffffffffffffe20);
    cfd::core::ByteData::~ByteData((ByteData *)0x619f7a);
    return local_4;
  }
  local_58[0].filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
               ,0x2f);
  local_58[0].filename = local_58[0].filename + 1;
  local_58[0].line = 0x7ad;
  local_58[0].funcname = "CfdAddMultisigSignDataToDer";
  cfd::core::logger::warn<>(local_58,"signature is null or empty.");
  local_7a = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  paVar3 = &local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"Failed to parameter. signature is null or empty.",paVar3);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffe40,error_code,in_stack_fffffffffffffe30);
  local_7a = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddMultisigSignDataToDer(
    void* handle, void* multisign_handle, const char* signature,
    int sighash_type, bool sighash_anyone_can_pay,
    const char* related_pubkey) {
  try {
    cfd::Initialize();
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }

    // encode to der
    SigHashType sighashtype = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
    ByteData signature_bytes = ByteData(std::string(signature));
    SignParameter param(signature_bytes, true, sighashtype);
    ByteData signature_der = param.ConvertToSignature();

    return CfdAddMultisigSignData(
        handle, multisign_handle, signature_der.GetHex().c_str(),
        related_pubkey);
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}